

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_proxy.cpp
# Opt level: O1

Error * __thiscall
ot::commissioner::ProxyEndpoint::Send
          (Error *__return_storage_ptr__,ProxyEndpoint *this,ByteArray *aRequest,
          MessageSubType aSubType)

{
  string *__rhs;
  ErrorCode EVar1;
  type tVar2;
  char *pcVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  bool bVar7;
  format_args args;
  format_args args_00;
  ByteArray udpPayload;
  writer write;
  Request udpTx;
  undefined1 local_1a0 [8];
  uchar *local_198;
  char local_190 [8];
  uchar local_188 [16];
  undefined1 local_178 [8];
  _Alloc_hider local_170;
  size_t local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160;
  parse_func local_150 [1];
  ByteArray local_148;
  string local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_110;
  ByteArray *local_108;
  void *local_100;
  long local_f8;
  _Any_data local_e8;
  code *local_d8;
  undefined8 uStack_d0;
  writer local_c0;
  Message local_b8;
  
  __return_storage_ptr__->mCode = kNone;
  __rhs = &__return_storage_ptr__->mMessage;
  local_110 = &(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p = (pointer)local_110;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  local_108 = aRequest;
  coap::Message::Message(&local_b8,kNonConfirmable,kPost);
  local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (*(this->super_Endpoint)._vptr_Endpoint[3])
            ((format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_178,this);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_178._4_4_,local_178._0_4_) ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_p) {
    bVar7 = true;
  }
  else {
    (*(this->super_Endpoint)._vptr_Endpoint[3])(&local_100,this);
    bVar7 = local_f8 - (long)local_100 != 0x10;
    if (local_100 != (void *)0x0) {
      operator_delete(local_100);
    }
  }
  if ((void *)CONCAT44(local_178._4_4_,local_178._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_178._4_4_,local_178._0_4_));
  }
  if (bVar7) {
    local_178._0_4_ = none_type;
    local_170._M_p = "no valid IPv6 peer address";
    local_168 = 0x1a;
    local_160._M_allocated_capacity = 0;
    local_150[0] = (parse_func)0x0;
    pcVar6 = "no valid IPv6 peer address";
    local_160._8_8_ =
         (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)local_178;
    do {
      pcVar5 = pcVar6 + 1;
      if (*pcVar6 == '}') {
        if ((pcVar5 == "") || (*pcVar5 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar5 = pcVar6 + 2;
      }
      else if (*pcVar6 == '{') {
        pcVar5 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar6,"",
                            (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_178);
      }
      pcVar6 = pcVar5;
    } while (pcVar5 != "");
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_178;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_130,(v10 *)"no valid IPv6 peer address",(string_view)ZEXT816(0x1a),args);
    local_1a0._0_4_ = 0xf;
    local_198 = local_188;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_198,local_130._M_dataplus._M_p,
               local_130._M_dataplus._M_p + local_130._M_string_length);
  }
  else {
    if ((this->mBrClient->mDtlsSession).mState == kConnected) {
      utils::Encode<unsigned_short>(&local_148,0xf0bf);
      iVar4 = (*(this->super_Endpoint)._vptr_Endpoint[4])(this);
      utils::Encode<unsigned_short>(&local_148,(unsigned_short)iVar4);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_148,
                 local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_finish,
                 (local_108->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                 _M_impl.super__Vector_impl_data._M_start);
      local_1a0 = (undefined1  [8])local_190;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"/c/ut","");
      coap::Message::SetUriPath((Error *)local_178,&local_b8,(string *)local_1a0);
      __return_storage_ptr__->mCode = local_178._0_4_;
      std::__cxx11::string::operator=((string *)__rhs,(string *)&local_170);
      EVar1 = __return_storage_ptr__->mCode;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_p != &local_160) {
        operator_delete(local_170._M_p);
      }
      if (local_1a0 != (undefined1  [8])local_190) {
        operator_delete((void *)local_1a0);
      }
      if (EVar1 == kNone) {
        tlv::Tlv::Tlv((Tlv *)local_1a0,kIpv6Address,&(this->mPeerAddr).mBytes,kMeshCoP);
        AppendTlv((Error *)local_178,&local_b8,(Tlv *)local_1a0);
        __return_storage_ptr__->mCode = local_178._0_4_;
        std::__cxx11::string::operator=((string *)__rhs,(string *)&local_170);
        EVar1 = __return_storage_ptr__->mCode;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_p != &local_160) {
          operator_delete(local_170._M_p);
        }
        if (local_198 != (uchar *)0x0) {
          operator_delete(local_198);
        }
        if (EVar1 == kNone) {
          tlv::Tlv::Tlv((Tlv *)local_1a0,kUdpEncapsulation,&local_148,kMeshCoP);
          AppendTlv((Error *)local_178,&local_b8,(Tlv *)local_1a0);
          __return_storage_ptr__->mCode = local_178._0_4_;
          std::__cxx11::string::operator=((string *)__rhs,(string *)&local_170);
          EVar1 = __return_storage_ptr__->mCode;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_170._M_p != &local_160) {
            operator_delete(local_170._M_p);
          }
          if (local_198 != (uchar *)0x0) {
            operator_delete(local_198);
          }
          if (EVar1 == kNone) {
            local_d8 = (code *)0x0;
            uStack_d0 = 0;
            local_e8._M_unused._M_object = (void *)0x0;
            local_e8._8_8_ = 0;
            coap::CoapSecure::SendRequest(this->mBrClient,&local_b8,(ResponseHandler *)&local_e8);
            if (local_d8 != (code *)0x0) {
              (*local_d8)(&local_e8,&local_e8,__destroy_functor);
            }
          }
        }
      }
      goto LAB_001f2811;
    }
    local_178._0_4_ = none_type;
    pcVar6 = "not connected to the border agent";
    local_170._M_p = "not connected to the border agent";
    local_168 = 0x21;
    local_160._M_allocated_capacity = 0;
    local_150[0] = (parse_func)0x0;
    local_160._8_8_ =
         (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)local_178;
    local_c0.handler_ =
         (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)local_178;
    do {
      if (pcVar6 == "") break;
      pcVar5 = pcVar6;
      if (*pcVar6 == '{') {
LAB_001f2758:
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()(&local_c0,pcVar6,pcVar5);
        pcVar6 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar5,"",
                            (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_178);
        bVar7 = true;
      }
      else {
        pcVar5 = pcVar6 + 1;
        bVar7 = pcVar5 != "";
        if (bVar7) {
          if (*pcVar5 != '{') {
            pcVar3 = pcVar6 + 2;
            do {
              pcVar5 = pcVar3;
              bVar7 = pcVar5 != "";
              if (pcVar5 == "") goto LAB_001f2754;
              pcVar3 = pcVar5 + 1;
            } while (*pcVar5 != '{');
          }
          bVar7 = true;
        }
LAB_001f2754:
        if (bVar7) goto LAB_001f2758;
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()(&local_c0,pcVar6,"");
        bVar7 = false;
      }
    } while (bVar7);
    args_00.field_1.args_ = in_R9.args_;
    args_00.desc_ = (unsigned_long_long)local_178;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_130,(v10 *)"not connected to the border agent",(string_view)ZEXT816(0x21),
               args_00);
    local_1a0._0_4_ = 0xf;
    local_198 = local_188;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_198,local_130._M_dataplus._M_p,
               local_130._M_dataplus._M_p + local_130._M_string_length);
  }
  __return_storage_ptr__->mCode = local_1a0._0_4_;
  std::__cxx11::string::operator=((string *)__rhs,(string *)&local_198);
  if (local_198 != local_188) {
    operator_delete(local_198);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p);
  }
LAB_001f2811:
  tVar2 = __return_storage_ptr__->mCode;
  if (tVar2 != none_type) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0,
                   "sending UDP_TX.ntf message failed, ",__rhs);
    local_178._0_4_ = tVar2;
    local_170._M_p = (pointer)&local_160;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_170,local_1a0,local_198 + (long)local_1a0);
    __return_storage_ptr__->mCode = local_178._0_4_;
    std::__cxx11::string::operator=((string *)__rhs,(string *)&local_170);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_p != &local_160) {
      operator_delete(local_170._M_p);
    }
    if (local_1a0 != (undefined1  [8])local_190) {
      operator_delete((void *)local_1a0);
    }
  }
  if (local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_148.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.mRequestUri._M_dataplus._M_p != &local_b8.mRequestUri.field_2) {
    operator_delete(local_b8.mRequestUri._M_dataplus._M_p);
  }
  if (local_b8.mPayload.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.mPayload.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<ot::commissioner::coap::OptionType,_std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>,_std::_Select1st<std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>_>,_std::less<ot::commissioner::coap::OptionType>,_std::allocator<std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>_>_>
  ::~_Rb_tree(&local_b8.mOptions._M_t);
  return __return_storage_ptr__;
}

Assistant:

Error ProxyEndpoint::Send(const ByteArray &aRequest, MessageSubType aSubType)
{
    Error         error;
    coap::Request udpTx{coap::Type::kNonConfirmable, coap::Code::kPost};
    ByteArray     udpPayload;

    (void)aSubType;

    VerifyOrExit(GetPeerAddr().IsValid() && GetPeerAddr().IsIpv6(),
                 error = ERROR_INVALID_STATE("no valid IPv6 peer address"));

    VerifyOrExit(mBrClient.IsConnected(), error = ERROR_INVALID_STATE("not connected to the border agent"));

    // set the source port to default mamagement port for UDP_Tx message
    utils::Encode<uint16_t>(udpPayload, kDefaultMmPort);
    utils::Encode<uint16_t>(udpPayload, GetPeerPort());
    udpPayload.insert(udpPayload.end(), aRequest.begin(), aRequest.end());

    SuccessOrExit(error = udpTx.SetUriPath(uri::kUdpTx));
    SuccessOrExit(error = AppendTlv(udpTx, {tlv::Type::kIpv6Address, mPeerAddr.GetRaw()}));
    SuccessOrExit(error = AppendTlv(udpTx, {tlv::Type::kUdpEncapsulation, udpPayload}));

    mBrClient.SendRequest(udpTx, nullptr);

exit:
    if (error != ErrorCode::kNone)
    {
        error = Error{error.GetCode(), "sending UDP_TX.ntf message failed, " + error.GetMessage()};
    }
    return error;
}